

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ceilingFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  code *pcVar1;
  int iVar2;
  i64 iVal;
  double rVal;
  
  iVar2 = sqlite3_value_numeric_type(*argv);
  if (iVar2 == 2) {
    pcVar1 = (code *)context->pFunc->pUserData;
    sqlite3VdbeRealValue(*argv);
    rVal = (double)(*pcVar1)();
    sqlite3_result_double(context,rVal);
    return;
  }
  if (iVar2 == 1) {
    iVal = sqlite3VdbeIntValue(*argv);
    sqlite3_result_int64(context,iVal);
    return;
  }
  return;
}

Assistant:

static void ceilingFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  switch( sqlite3_value_numeric_type(argv[0]) ){
    case SQLITE_INTEGER: {
       sqlite3_result_int64(context, sqlite3_value_int64(argv[0]));
       break;
    }
    case SQLITE_FLOAT: {
       double (*x)(double) = (double(*)(double))sqlite3_user_data(context);
       sqlite3_result_double(context, x(sqlite3_value_double(argv[0])));
       break;
    }
    default: {
       break;
    }
  }
}